

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O2

void __thiscall
anurbs::TrimmedSurfaceClipping::TrimmedSurfaceClipping
          (TrimmedSurfaceClipping *this,double tolerance,double unit)

{
  allocator_type local_2a;
  allocator_type local_29;
  double local_28;
  double local_20;
  
  (this->m_paths).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_paths).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_paths).
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = unit;
  local_20 = tolerance;
  std::vector<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>::vector
            (&this->m_span_trim_type,0,&local_29);
  std::
  vector<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ::vector(&this->m_span_polygons,0,&local_2a);
  this->m_scale = local_28;
  this->m_tolerance = local_20;
  (this->m_spans_u).super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spans_u).super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spans_u).super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spans_v).super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spans_v).super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spans_v).super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TrimmedSurfaceClipping(const double tolerance, const double unit)
        : m_tolerance(tolerance)
        , m_scale(unit)
        , m_span_polygons(0)
        , m_span_trim_type(0)
    {
    }